

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast_node.h
# Opt level: O2

void __thiscall mocker::ast::CompoundStmt::~CompoundStmt(CompoundStmt *this)

{
  (this->super_Statement).super_ASTNode._vptr_ASTNode = (_func_int **)&PTR__CompoundStmt_001f33b0;
  std::
  vector<std::shared_ptr<mocker::ast::Statement>,_std::allocator<std::shared_ptr<mocker::ast::Statement>_>_>
  ::~vector(&this->stmts);
  std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
            (&(this->super_Statement).super_ASTNode.
              super_enable_shared_from_this<mocker::ast::ASTNode>._M_weak_this.
              super___weak_ptr<mocker::ast::ASTNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return;
}

Assistant:

explicit CompoundStmt(std::vector<std::shared_ptr<Statement>> stmts)
      : stmts(std::move(stmts)) {}